

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int consume_data(j_decompress_ptr cinfo)

{
  jpeg_component_info *pjVar1;
  int iVar2;
  boolean bVar3;
  uint uVar4;
  JBLOCKARRAY ppaJVar5;
  j_decompress_ptr in_RDI;
  jpeg_component_info *compptr;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer [4];
  JDIMENSION start_col;
  int yoffset;
  int yindex;
  int xindex;
  int ci;
  int blkn;
  JDIMENSION MCU_col_num;
  my_coef_ptr coef;
  _func_void_j_decompress_ptr *local_60;
  long alStack_58 [4];
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  jpeg_d_coef_controller *local_18;
  j_decompress_ptr local_10;
  int local_4;
  
  local_18 = in_RDI->coef;
  local_10 = in_RDI;
  for (local_24 = 0; local_24 < local_10->comps_in_scan; local_24 = local_24 + 1) {
    pjVar1 = local_10->cur_comp_info[local_24];
    ppaJVar5 = (*local_10->mem->access_virt_barray)
                         ((j_common_ptr)local_10,
                          (jvirt_barray_ptr)(&local_18[3].decompress_data)[pjVar1->component_index],
                          local_10->input_iMCU_row * pjVar1->v_samp_factor,pjVar1->v_samp_factor,1);
    alStack_58[local_24] = (long)ppaJVar5;
  }
  local_30 = *(int *)((long)&local_18[1].start_input_pass + 4);
  do {
    if (*(int *)&local_18[1].consume_data <= local_30) {
      uVar4 = local_10->input_iMCU_row + 1;
      local_10->input_iMCU_row = uVar4;
      if (uVar4 < local_10->total_iMCU_rows) {
        start_iMCU_row(local_10);
        local_4 = 3;
      }
      else {
        (*local_10->inputctl->finish_input_pass)(local_10);
        local_4 = 4;
      }
      return local_4;
    }
    for (local_1c = *(uint *)&local_18[1].start_input_pass; local_1c < local_10->MCUs_per_row;
        local_1c = local_1c + 1) {
      local_20 = 0;
      for (local_24 = 0; local_24 < local_10->comps_in_scan; local_24 = local_24 + 1) {
        pjVar1 = local_10->cur_comp_info[local_24];
        local_34 = local_1c * pjVar1->MCU_width;
        for (local_2c = 0; local_2c < pjVar1->MCU_height; local_2c = local_2c + 1) {
          local_60 = (_func_void_j_decompress_ptr *)
                     (*(long *)(alStack_58[local_24] + (long)(local_2c + local_30) * 8) +
                     (ulong)local_34 * 0x80);
          for (local_28 = 0; iVar2 = local_20, local_28 < pjVar1->MCU_width; local_28 = local_28 + 1
              ) {
            local_20 = local_20 + 1;
            (&local_18[1].start_output_pass)[iVar2] = local_60;
            local_60 = local_60 + 0x80;
          }
        }
      }
      if (local_10->entropy->insufficient_data == 0) {
        local_10->master->last_good_iMCU_row = local_10->input_iMCU_row;
      }
      bVar3 = (*local_10->entropy->decode_mcu)(local_10,(JBLOCKROW *)&local_18[1].start_output_pass)
      ;
      if (bVar3 == 0) {
        *(int *)((long)&local_18[1].start_input_pass + 4) = local_30;
        *(uint *)&local_18[1].start_input_pass = local_1c;
        return 0;
      }
    }
    *(undefined4 *)&local_18[1].start_input_pass = 0;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
consume_data(j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
         MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;                 /* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        start_col = MCU_col_num * compptr->MCU_width;
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          buffer_ptr = buffer[ci][yindex + yoffset] + start_col;
          for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
            coef->MCU_buffer[blkn++] = buffer_ptr++;
          }
        }
      }
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      /* Try to fetch the MCU. */
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}